

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPutI(Vec_Str_t *vOut,int Val)

{
  undefined4 local_14;
  int Val_local;
  Vec_Str_t *vOut_local;
  
  for (local_14 = Val; 0x7f < local_14; local_14 = local_14 >> 7) {
    Vec_StrPush(vOut,(byte)local_14 | 0x80);
  }
  Vec_StrPush(vOut,(byte)local_14);
  return;
}

Assistant:

static inline void Vec_StrPutI( Vec_Str_t * vOut, int Val )
{
    for ( ; Val >= 0x80; Val >>= 7 )
        Vec_StrPush( vOut, (unsigned char)(Val | 0x80) );
    Vec_StrPush( vOut, (unsigned char)Val );
}